

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_ManBoxNum_rec(Bac_Ntk_t *p)

{
  int iVar1;
  Bac_Ntk_t *p_00;
  int local_28;
  int local_20;
  int local_1c;
  int Counter;
  int iObj;
  Bac_Ntk_t *p_local;
  
  local_20 = 0;
  if (p->Count < 0) {
    for (local_1c = 0; iVar1 = Bac_NtkObjNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
      iVar1 = Bac_ObjIsBox(p,local_1c);
      if (iVar1 != 0) {
        iVar1 = Bac_ObjIsBoxUser(p,local_1c);
        if (iVar1 == 0) {
          local_28 = 1;
        }
        else {
          p_00 = Bac_BoxNtk(p,local_1c);
          local_28 = Bac_ManBoxNum_rec(p_00);
        }
        local_20 = local_28 + local_20;
      }
    }
    p->Count = local_20;
    p_local._4_4_ = local_20;
  }
  else {
    p_local._4_4_ = p->Count;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Bac_ManBoxNum_rec( Bac_Ntk_t * p )
{
    int iObj, Counter = 0;
    if ( p->Count >= 0 )
        return p->Count;
    Bac_NtkForEachBox( p, iObj )
        Counter += Bac_ObjIsBoxUser(p, iObj) ? Bac_ManBoxNum_rec( Bac_BoxNtk(p, iObj) ) : 1;
    return (p->Count = Counter);
}